

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_request.hpp
# Opt level: O2

void __thiscall libtorrent::dht::direct_observer::timeout(direct_observer *this)

{
  byte bVar1;
  bdecode_node e;
  msg m;
  undefined1 local_98 [28];
  undefined4 local_7c;
  undefined1 auStack_78 [12];
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  data_union local_4c;
  msg local_30;
  
  bVar1 = (this->super_observer).flags.m_val;
  if (-1 < (char)bVar1) {
    (this->super_observer).flags.m_val = bVar1 | 0x80;
    auStack_78 = SUB1612((undefined1  [16])0x0,4);
    local_98._16_12_ = SUB1612((undefined1  [16])0x0,0);
    local_7c = 0;
    local_98._0_16_ = (undefined1  [16])0x0;
    local_6c = 0xffffffff;
    uStack_68 = 0xffffffff;
    uStack_64 = 0xffffffff;
    uStack_60 = 0xffffffff;
    observer::target_ep((endpoint *)&local_4c.base,&this->super_observer);
    local_30.addr.impl_.data_._0_8_ = local_4c._0_8_;
    local_30.addr.impl_.data_._20_8_ = local_4c._20_8_;
    local_30.message = (bdecode_node *)local_98;
    direct_traversal::invoke_cb
              ((direct_traversal *)
               (this->super_observer).m_algorithm.
               super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_30);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)local_98);
  }
  return;
}

Assistant:

void timeout() override
	{
		if (flags & flag_done) return;
		flags |= flag_done;
		bdecode_node e;
		msg m(e, target_ep());
		static_cast<direct_traversal*>(algorithm())->invoke_cb(m);
	}